

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

bool __thiscall Json::StyledStreamWriter::isMultineArray(StyledStreamWriter *this,Value *value)

{
  bool bVar1;
  bool bVar2;
  ArrayIndex AVar3;
  ArrayIndex AVar4;
  Value *pVVar5;
  int index;
  int iVar6;
  long lVar7;
  int index_1;
  long lVar8;
  
  AVar3 = Value::size(value);
  bVar1 = this->rightMargin_ <= (int)(AVar3 * 3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->childValues_);
  iVar6 = 0;
  do {
    if (((int)AVar3 <= iVar6) || (bVar1)) {
      bVar2 = true;
      if (!bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reserve(&this->childValues_,(long)(int)AVar3);
        this->addChildValues_ = true;
        iVar6 = AVar3 * 2 + 2;
        lVar7 = 8;
        for (lVar8 = 0; lVar8 < (int)AVar3; lVar8 = lVar8 + 1) {
          pVVar5 = Value::operator[](value,(int)lVar8);
          writeValue(this,pVVar5);
          iVar6 = iVar6 + *(int *)((long)&(((this->childValues_).
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                          ._M_p + lVar7);
          lVar7 = lVar7 + 0x20;
        }
        this->addChildValues_ = false;
        bVar2 = this->rightMargin_ <= iVar6;
      }
      return bVar2;
    }
    pVVar5 = Value::operator[](value,iVar6);
    bVar1 = Value::isArray(pVVar5);
    if (bVar1) {
LAB_0016f1f5:
      AVar4 = Value::size(pVVar5);
      bVar1 = AVar4 != 0;
    }
    else {
      bVar1 = Value::isObject(pVVar5);
      if (bVar1) goto LAB_0016f1f5;
      bVar1 = false;
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

bool 
StyledStreamWriter::isMultineArray( const Value &value )
{
   int size = value.size();
   bool isMultiLine = size*3 >= rightMargin_ ;
   childValues_.clear();
   for ( int index =0; index < size  &&  !isMultiLine; ++index )
   {
      const Value &childValue = value[index];
      isMultiLine = isMultiLine  ||
                     ( (childValue.isArray()  ||  childValue.isObject())  &&  
                        childValue.size() > 0 );
   }
   if ( !isMultiLine ) // check if line length > max line length
   {
      childValues_.reserve( size );
      addChildValues_ = true;
      int lineLength = 4 + (size-1)*2; // '[ ' + ', '*n + ' ]'
      for ( int index =0; index < size  &&  !isMultiLine; ++index )
      {
         writeValue( value[index] );
         lineLength += int( childValues_[index].length() );
         isMultiLine = isMultiLine  &&  hasCommentForValue( value[index] );
      }
      addChildValues_ = false;
      isMultiLine = isMultiLine  ||  lineLength >= rightMargin_;
   }
   return isMultiLine;
}